

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_cast_helper.hpp
# Opt level: O0

shared_ptr<std::exception>
chaiscript::detail::Cast_Helper_Inner<std::shared_ptr<std::exception>_>::cast
          (Boxed_Value *ob,Type_Conversions_State *param_2)

{
  Any *this;
  shared_ptr<std::exception> *psVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<std::exception> sVar2;
  Type_Conversions_State *param_1_local;
  Boxed_Value *ob_local;
  
  this = Boxed_Value::get((Boxed_Value *)param_2);
  psVar1 = Any::cast<std::shared_ptr<std::exception>>(this);
  std::shared_ptr<std::exception>::shared_ptr((shared_ptr<std::exception> *)ob,psVar1);
  sVar2.super___shared_ptr<std::exception,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<std::exception,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)ob;
  return (shared_ptr<std::exception>)
         sVar2.super___shared_ptr<std::exception,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static auto cast(const Boxed_Value &ob, const Type_Conversions_State *) { return ob.get().cast<std::shared_ptr<Result>>(); }